

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.c
# Opt level: O0

size_t UTF8Position(size_t last,size_t c,size_t clamp)

{
  size_t local_58;
  size_t local_50;
  size_t clamp_local;
  size_t c_local;
  size_t last_local;
  
  if (c < 0x80) {
    last_local = 0;
  }
  else if (c < 0xc0) {
    if (last < 0xe0) {
      last_local = 0;
    }
    else {
      local_58 = clamp;
      if (2 < clamp) {
        local_58 = 2;
      }
      last_local = local_58;
    }
  }
  else {
    local_50 = clamp;
    if (1 < clamp) {
      local_50 = 1;
    }
    last_local = local_50;
  }
  return last_local;
}

Assistant:

static size_t UTF8Position(size_t last, size_t c, size_t clamp) {
  if (c < 128) {
    return 0;  /* Next one is the 'Byte 1' again. */
  } else if (c >= 192) {  /* Next one is the 'Byte 2' of utf-8 encoding. */
    return BROTLI_MIN(size_t, 1, clamp);
  } else {
    /* Let's decide over the last byte if this ends the sequence. */
    if (last < 0xE0) {
      return 0;  /* Completed two or three byte coding. */
    } else {  /* Next one is the 'Byte 3' of utf-8 encoding. */
      return BROTLI_MIN(size_t, 2, clamp);
    }
  }
}